

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_checkf(mpc_parser_t *a,mpc_dtor_t da,mpc_check_t f,char *fmt,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  mpc_parser_t *local_58;
  mpc_parser_t *p;
  char *buffer;
  va_list va;
  char *fmt_local;
  mpc_check_t f_local;
  mpc_dtor_t da_local;
  mpc_parser_t *a_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_108;
  va[0]._0_8_ = &stack0x00000008;
  buffer._4_4_ = 0x30;
  buffer._0_4_ = 0x20;
  local_e8 = in_R8;
  local_e0 = in_R9;
  p = (mpc_parser_t *)malloc(0x800);
  vsprintf((char *)p,fmt,&buffer);
  local_58 = mpc_check(a,da,f,(char *)p);
  free(p);
  return local_58;
}

Assistant:

mpc_parser_t *mpc_checkf(mpc_parser_t *a, mpc_dtor_t da, mpc_check_t f, const char *fmt, ...) {
  va_list va;
  char *buffer;
  mpc_parser_t *p;

  va_start(va, fmt);
  buffer = malloc(2048);
  vsprintf(buffer, fmt, va);
  va_end(va);

  p = mpc_check(a, da, f, buffer);
  free(buffer);

  return p;
}